

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapGraph.c
# Opt level: O0

void Amap_ManCreate(Amap_Man_t *p,Aig_Man_t *pAig)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  Amap_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  Amap_Obj_t *pAVar6;
  Amap_Obj_t *pFanC_00;
  int local_7c;
  int fChoices;
  int i;
  Aig_Obj_t *pFanC;
  Aig_Obj_t *pFan1;
  Aig_Obj_t *pFan0;
  Aig_Obj_t *pPrev;
  Aig_Obj_t *pFanin;
  Aig_Obj_t *pObj;
  Amap_Obj_t *pChoices [4];
  Vec_Ptr_t *local_20;
  Vec_Ptr_t *vNodes;
  Aig_Man_t *pAig_local;
  Amap_Man_t *p_local;
  
  if (pAig->pEquivs == (Aig_Obj_t **)0x0) {
    local_20 = Aig_ManDfs(pAig,1);
  }
  else {
    local_20 = Aig_ManDfsChoices(pAig);
  }
  pAVar4 = Amap_ManCreateConst1(p);
  p->pConst1 = pAVar4;
  if ((p->pPars->fVerbose != 0) &&
     (iVar2 = Aig_ManObjNum(pAig), 0.1 < ((double)iVar2 * 1.0 * 96.0) / 1073741824.0)) {
    iVar2 = Aig_ManObjNum(pAig);
    uVar3 = Aig_ManObjNum(pAig);
    printf("Warning: Mapper allocates %.3f GB for subject graph with %d objects.\n",
           ((double)iVar2 * 1.0 * 96.0) / 1073741824.0,(ulong)uVar3);
  }
  Aig_ManCleanData(pAig);
  pAVar4 = Amap_ManConst1(p);
  pAVar5 = Aig_ManConst1(pAig);
  (pAVar5->field_5).pData = pAVar4;
  for (local_7c = 0; iVar2 = Vec_PtrSize(pAig->vCis), local_7c < iVar2; local_7c = local_7c + 1) {
    pFanin = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCis,local_7c);
    pAVar4 = Amap_ManCreatePi(p);
    (pFanin->field_5).pData = pAVar4;
  }
  for (local_7c = 0; iVar2 = Vec_PtrSize(local_20), local_7c < iVar2; local_7c = local_7c + 1) {
    pFanin = (Aig_Obj_t *)Vec_PtrEntry(local_20,local_7c);
    bVar1 = false;
    if ((p->fUseXor == 0) || (iVar2 = Aig_ObjRecognizeExor(pFanin,&pFan1,&pFanC), iVar2 == 0)) {
      if ((p->fUseMux != 0) && (iVar2 = Aig_ObjIsMuxType(pFanin), iVar2 != 0)) {
        pAVar5 = Aig_ObjRecognizeMux(pFanin,&pFanC,&pFan1);
        pAVar4 = Amap_AndToObj(pFan1);
        pAVar6 = Amap_AndToObj(pFanC);
        pFanC_00 = Amap_AndToObj(pAVar5);
        Amap_ManCreateMuxChoices(p,pAVar4,pAVar6,pFanC_00,(Amap_Obj_t **)&pObj);
        bVar1 = true;
      }
    }
    else {
      pAVar4 = Amap_AndToObj(pFan1);
      pAVar6 = Amap_AndToObj(pFanC);
      Amap_ManCreateXorChoices(p,pAVar4,pAVar6,(Amap_Obj_t **)&pObj);
      bVar1 = true;
    }
    pAVar4 = (Amap_Obj_t *)Aig_ObjChild0Copy(pFanin);
    pAVar6 = (Amap_Obj_t *)Aig_ObjChild1Copy(pFanin);
    pAVar4 = Amap_ManCreateAnd(p,pAVar4,pAVar6);
    (pFanin->field_5).pData = pAVar4;
    if (bVar1) {
      p->nChoicesAdded = p->nChoicesAdded + 1;
      Amap_ObjSetChoice((Amap_Obj_t *)(pFanin->field_5).pData,(Amap_Obj_t *)pObj);
      Amap_ObjSetChoice((Amap_Obj_t *)pObj,pChoices[0]);
      Amap_ObjSetChoice(pChoices[0],pChoices[1]);
      Amap_ObjSetChoice(pChoices[1],pChoices[2]);
      Amap_ManCreateChoice(p,(Amap_Obj_t *)(pFanin->field_5).pData);
    }
    iVar2 = Aig_ObjIsChoice(pAig,pFanin);
    if (iVar2 != 0) {
      p->nChoicesGiven = p->nChoicesGiven + 1;
      pFan0 = pFanin;
      for (pPrev = Aig_ObjEquiv(pAig,pFanin); pPrev != (Aig_Obj_t *)0x0;
          pPrev = Aig_ObjEquiv(pAig,pPrev)) {
        *(ulong *)(pPrev->field_5).pData = *(pPrev->field_5).pData & 0xbfffffffffffffff;
        pAVar4 = Amap_ManGetLast_rec(p,(Amap_Obj_t *)(pFan0->field_5).pData);
        Amap_ObjSetChoice(pAVar4,(Amap_Obj_t *)(pPrev->field_5).pData);
        pFan0 = pPrev;
      }
      Amap_ManCreateChoice(p,(Amap_Obj_t *)(pFanin->field_5).pData);
    }
  }
  Vec_PtrFree(local_20);
  for (local_7c = 0; iVar2 = Vec_PtrSize(pAig->vCos), local_7c < iVar2; local_7c = local_7c + 1) {
    pFanin = (Aig_Obj_t *)Vec_PtrEntry(pAig->vCos,local_7c);
    pAVar4 = (Amap_Obj_t *)Aig_ObjChild0Copy(pFanin);
    pAVar4 = Amap_ManCreatePo(p,pAVar4);
    (pFanin->field_5).pData = pAVar4;
  }
  if (p->pPars->fVerbose != 0) {
    printf("Performing mapping with %d given and %d created choices.\n",
           (ulong)(uint)p->nChoicesGiven,(ulong)(uint)p->nChoicesAdded);
  }
  return;
}

Assistant:

void Amap_ManCreate( Amap_Man_t * p, Aig_Man_t * pAig )
{
    Vec_Ptr_t * vNodes;
    Amap_Obj_t * pChoices[4];
    Aig_Obj_t * pObj, * pFanin, * pPrev, * pFan0, * pFan1, * pFanC;
    int i, fChoices;
    if ( pAig->pEquivs )
        vNodes = Aig_ManDfsChoices( pAig );
    else
        vNodes = Aig_ManDfs( pAig, 1 );
    p->pConst1 = Amap_ManCreateConst1( p );
    // print warning about excessive memory usage
    if ( p->pPars->fVerbose )
    {
        if ( 1.0 * Aig_ManObjNum(pAig) * sizeof(Amap_Obj_t) / (1<<30) > 0.1 )
        printf( "Warning: Mapper allocates %.3f GB for subject graph with %d objects.\n", 
            1.0 * Aig_ManObjNum(pAig) * sizeof(Amap_Obj_t) / (1<<30), Aig_ManObjNum(pAig) );
    }
    // create PIs and remember them in the old nodes
    Aig_ManCleanData(pAig);
    Aig_ManConst1(pAig)->pData = Amap_ManConst1( p );
    Aig_ManForEachCi( pAig, pObj, i )
        pObj->pData = Amap_ManCreatePi( p );
    // load the AIG into the mapper
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
    {
        fChoices = 0;
        if ( p->fUseXor && Aig_ObjRecognizeExor(pObj, &pFan0, &pFan1 ) )
        {
            Amap_ManCreateXorChoices( p, Amap_AndToObj(pFan0), Amap_AndToObj(pFan1), pChoices );
            fChoices = 1;
        }
        else if ( p->fUseMux && Aig_ObjIsMuxType(pObj) )
        {
            pFanC = Aig_ObjRecognizeMux( pObj, &pFan1, &pFan0 );
            Amap_ManCreateMuxChoices( p, Amap_AndToObj(pFan0), Amap_AndToObj(pFan1), Amap_AndToObj(pFanC), pChoices );
            fChoices = 1;
        }
        pObj->pData = Amap_ManCreateAnd( p, (Amap_Obj_t *)Aig_ObjChild0Copy(pObj), (Amap_Obj_t *)Aig_ObjChild1Copy(pObj) );
        if ( fChoices )
        {
            p->nChoicesAdded++;
            Amap_ObjSetChoice( (Amap_Obj_t *)pObj->pData, pChoices[0] );
            Amap_ObjSetChoice( pChoices[0], pChoices[1] );
            Amap_ObjSetChoice( pChoices[1], pChoices[2] );
            Amap_ObjSetChoice( pChoices[2], pChoices[3] );
            Amap_ManCreateChoice( p, (Amap_Obj_t *)pObj->pData );
        }
        if ( Aig_ObjIsChoice( pAig, pObj ) )
        {
//            assert( !fChoices );
            p->nChoicesGiven++;
            for ( pPrev = pObj, pFanin = Aig_ObjEquiv(pAig, pObj); pFanin; pPrev = pFanin, pFanin = Aig_ObjEquiv(pAig, pFanin) )
            {
                ((Amap_Obj_t *)pFanin->pData)->fRepr = 0;
                Amap_ObjSetChoice( Amap_ManGetLast_rec(p, (Amap_Obj_t *)pPrev->pData), 
                    (Amap_Obj_t *)pFanin->pData );
            }
            Amap_ManCreateChoice( p, (Amap_Obj_t *)pObj->pData );
        }
    }
    Vec_PtrFree( vNodes );
    // set the primary outputs without copying the phase
    Aig_ManForEachCo( pAig, pObj, i )
        pObj->pData = Amap_ManCreatePo( p, (Amap_Obj_t *)Aig_ObjChild0Copy(pObj) );
    if ( p->pPars->fVerbose )
        printf( "Performing mapping with %d given and %d created choices.\n", 
            p->nChoicesGiven, p->nChoicesAdded );
}